

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

Box * __thiscall amrex::BoxArray::operator[](Box *__return_storage_ptr__,BoxArray *this,MFIter *mfi)

{
  operator[](__return_storage_ptr__,this,
             (mfi->index_map->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             [mfi->currentIndex]);
  return __return_storage_ptr__;
}

Assistant:

Box
BoxArray::operator[] (const MFIter& mfi) const noexcept
{
    return (*this)[mfi.index()];
}